

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * string_from_abi_cxx11_
                   (string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *values)

{
  uint uVar1;
  uint __val;
  string *psVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint __len;
  uint *puVar6;
  bool bVar7;
  string __str;
  stringstream buf;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string *local_1c8;
  uint *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
  puVar6 = (uint *)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  local_1c0 = (uint *)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
  if (puVar6 != local_1c0) {
    bVar7 = true;
    do {
      uVar1 = *puVar6;
      if (bVar7) {
        bVar7 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar5 = (ulong)__val;
        uVar3 = 4;
        do {
          __len = uVar3;
          uVar4 = (uint)uVar5;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_001aff40;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_001aff40;
          }
          if (uVar4 < 10000) goto LAB_001aff40;
          uVar5 = uVar5 / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_001aff40:
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)__len - (char)((int)uVar1 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_1e8 + (ulong)(uVar1 >> 0x1f)),__len,__val);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1e8,local_1e0);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != local_1c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ]",2);
  psVar2 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string string_from(const std::vector<int> & values) {
    std::stringstream buf;

    buf << "[ ";
    bool first = true;
    for (auto e : values) {
        if (first) {
            first = false;
        } else {
            buf << ", ";
        }
        buf << std::to_string(e);
    }
    buf << " ]";

    return buf.str();
}